

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O1

int ikcp_setmtu(ikcpcb *kcp,int mtu)

{
  int iVar1;
  char *pcVar2;
  ulong __size;
  
  iVar1 = -1;
  if (0x31 < mtu) {
    __size = (ulong)(mtu * 3 + 0x48);
    if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
      pcVar2 = (char *)malloc(__size);
    }
    else {
      pcVar2 = (char *)(*ikcp_malloc_hook)(__size);
    }
    if (pcVar2 == (char *)0x0) {
      iVar1 = -2;
    }
    else {
      kcp->mtu = mtu;
      kcp->mss = mtu - 0x18;
      if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
        free(kcp->buffer);
      }
      else {
        (*ikcp_free_hook)(kcp->buffer);
      }
      kcp->buffer = pcVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ikcp_setmtu(ikcpcb *kcp, int mtu)
{
	char *buffer;
	if (mtu < 50 || mtu < (int)IKCP_OVERHEAD) 
		return -1;
	buffer = (char*)ikcp_malloc((mtu + IKCP_OVERHEAD) * 3);
	if (buffer == NULL) 
		return -2;
	kcp->mtu = mtu;
	kcp->mss = kcp->mtu - IKCP_OVERHEAD;
	ikcp_free(kcp->buffer);
	kcp->buffer = buffer;
	return 0;
}